

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O2

int cuddZddLinearInPlace(DdManager *table,int x,int y)

{
  DdHalfWord *pDVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdHalfWord DVar4;
  uint uVar5;
  int iVar6;
  DdSubtable *pDVar7;
  DdNode **ppDVar8;
  DdNode **ppDVar9;
  DdNode *pDVar10;
  ulong uVar11;
  uint uVar12;
  DdNode *pDVar13;
  DdNode **ppDVar14;
  DdNode *pDVar15;
  DdNode *pDVar16;
  DdNode **ppDVar17;
  DdNode *pDVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  DdNode **ppDVar22;
  ulong uVar23;
  DdNode *pDVar24;
  DdNode *pDVar25;
  uint uVar26;
  DdNode *pDVar27;
  uint uVar28;
  uint uVar29;
  DdNode *pDVar30;
  
  zddTotalNumberLinearTr = zddTotalNumberLinearTr + 1;
  pDVar7 = table->subtableZ;
  DVar2 = table->invpermZ[x];
  ppDVar8 = pDVar7[x].nodelist;
  uVar28 = pDVar7[x].keys;
  iVar3 = pDVar7[x].shift;
  DVar4 = table->invpermZ[y];
  ppDVar9 = pDVar7[y].nodelist;
  uVar5 = pDVar7[y].keys;
  uVar29 = pDVar7[y].slots;
  iVar6 = pDVar7[y].shift;
  uVar23 = 0;
  uVar21 = (ulong)pDVar7[x].slots;
  if ((int)pDVar7[x].slots < 1) {
    uVar21 = uVar23;
  }
  pDVar24 = (DdNode *)0x0;
  pDVar16 = (DdNode *)0x0;
  for (; uVar23 != uVar21; uVar23 = uVar23 + 1) {
    pDVar27 = ppDVar8[uVar23];
    if (pDVar27 != (DdNode *)0x0) {
      ppDVar8[uVar23] = (DdNode *)0x0;
      pDVar10 = empty;
      while (pDVar27 != (DdNode *)0x0) {
        pDVar18 = pDVar27->next;
        pDVar30 = (pDVar27->type).kids.T;
        pDVar30->ref = pDVar30->ref - 1;
        pDVar15 = (pDVar27->type).kids.E;
        pDVar1 = &pDVar15->ref;
        *pDVar1 = *pDVar1 - 1;
        pDVar13 = pDVar16;
        pDVar25 = pDVar27;
        if (((pDVar30->index == DVar4) && ((pDVar30->type).kids.E == pDVar10)) &&
           (pDVar15->index != DVar4)) {
          pDVar13 = pDVar27;
          pDVar25 = pDVar24;
          pDVar24 = pDVar16;
        }
        pDVar27->next = pDVar24;
        pDVar16 = pDVar13;
        pDVar24 = pDVar25;
        pDVar27 = pDVar18;
      }
    }
  }
  uVar23 = 0;
  uVar21 = (ulong)uVar29;
  if ((int)uVar29 < 1) {
    uVar21 = uVar23;
  }
  for (; uVar29 = uVar5, uVar23 != uVar21; uVar23 = uVar23 + 1) {
    ppDVar14 = ppDVar9 + uVar23;
    while (pDVar27 = *ppDVar14, pDVar27 != (DdNode *)0x0) {
      if (pDVar27->ref != 0) {
        pDVar27->index = DVar2;
      }
      ppDVar14 = &pDVar27->next;
    }
  }
  while (bVar19 = (byte)iVar6, pDVar16 != (DdNode *)0x0) {
    pDVar27 = pDVar16->next;
    pDVar10 = (((pDVar16->type).kids.T)->type).kids.T;
    (pDVar16->type).kids.T = pDVar10;
    pDVar10->ref = pDVar10->ref + 1;
    pDVar18 = (pDVar16->type).kids.E;
    pDVar18->ref = pDVar18->ref + 1;
    pDVar16->index = DVar4;
    uVar26 = (((uint)pDVar18 & 1) + *(int *)(((ulong)pDVar18 & 0xfffffffffffffffe) + 0x20) * 2 +
             (((uint)pDVar10 & 1) + *(int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 0x20) * 2) *
             0xc00005) * 0x40f1f9 >> (bVar19 & 0x1f);
    pDVar16->next = ppDVar9[(int)uVar26];
    ppDVar9[(int)uVar26] = pDVar16;
    pDVar16 = pDVar27;
    uVar29 = uVar29 + 1;
  }
  uVar26 = 0;
  do {
    bVar20 = (byte)iVar3;
    if (pDVar24 == (DdNode *)0x0) {
      uVar23 = 0;
LAB_0063a2f0:
      if (uVar23 == uVar21) {
        pDVar7 = table->subtableZ;
        pDVar7[x].keys = uVar26;
        pDVar7[y].keys = uVar29;
        uVar28 = (uVar26 - (uVar5 + uVar28)) + uVar29 + table->keysZ;
        table->keysZ = uVar28;
        table->univ[y] = (DdNode *)(table->univ[x]->type).value;
        return uVar28;
      }
      ppDVar14 = ppDVar9 + uVar23;
      pDVar16 = *ppDVar14;
LAB_0063a302:
      pDVar24 = (DdNode *)0x0;
      do {
        while( true ) {
          pDVar27 = pDVar24;
          pDVar24 = pDVar16;
          if (pDVar24 == (DdNode *)0x0) {
            uVar23 = uVar23 + 1;
            goto LAB_0063a2f0;
          }
          pDVar16 = pDVar24->next;
          if (pDVar24->ref == 0) break;
          if (pDVar24->index == DVar2) {
            ppDVar22 = &pDVar27->next;
            if (pDVar27 == (DdNode *)0x0) {
              ppDVar22 = ppDVar14;
            }
            *ppDVar22 = pDVar16;
            pDVar10 = (pDVar24->type).kids.T;
            pDVar10->ref = pDVar10->ref - 1;
            uVar12 = (((uint)empty & 1) + *(int *)(((ulong)empty & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar10 & 1) +
                     *(int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                     0x40f1f9 >> (bVar19 & 0x1f);
            ppDVar22 = ppDVar9 + (int)uVar12;
            ppDVar17 = ppDVar22;
            while (pDVar18 = *ppDVar17, pDVar18 != (DdNode *)0x0) {
              if ((((pDVar18->type).kids.T == pDVar10) && ((pDVar18->type).kids.E == empty)) &&
                 (pDVar18->index == DVar4)) {
                pDVar18->ref = pDVar18->ref + 1;
                uVar29 = uVar29 - 1;
                goto LAB_0063a465;
              }
              ppDVar17 = &pDVar18->next;
            }
            pDVar18 = cuddDynamicAllocNode(table);
            if (pDVar18 == (DdNode *)0x0) goto LAB_0063a4e1;
            pDVar18->index = DVar4;
            pDVar18->ref = 1;
            (pDVar18->type).kids.T = pDVar10;
            (pDVar18->type).kids.E = empty;
            pDVar18->next = *ppDVar22;
            if (uVar12 == uVar23 && pDVar27 == (DdNode *)0x0) {
              pDVar27 = pDVar18;
            }
            *ppDVar22 = pDVar18;
            pDVar10->ref = pDVar10->ref + 1;
            empty->ref = empty->ref + 1;
LAB_0063a465:
            (pDVar24->type).kids.T = pDVar18;
            uVar11 = *(ulong *)((long)&pDVar24->type + 8);
            uVar12 = (((uint)uVar11 & 1) + *(int *)((uVar11 & 0xfffffffffffffffe) + 0x20) * 2 +
                     (((uint)pDVar18 & 1) +
                     *(int *)(((ulong)pDVar18 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                     0x40f1f9 >> (bVar20 & 0x1f);
            uVar26 = uVar26 + 1;
            pDVar24->next = ppDVar8[(int)uVar12];
            ppDVar8[(int)uVar12] = pDVar24;
            pDVar24 = pDVar27;
          }
        }
        pDVar1 = &((pDVar24->type).kids.T)->ref;
        *pDVar1 = *pDVar1 - 1;
        pDVar1 = &((pDVar24->type).kids.E)->ref;
        *pDVar1 = *pDVar1 - 1;
        pDVar24->next = table->nextFree;
        table->nextFree = pDVar24;
        uVar29 = uVar29 - 1;
        if (pDVar27 == (DdNode *)0x0) goto LAB_0063a4d1;
        pDVar27->next = pDVar16;
        pDVar24 = pDVar27;
      } while( true );
    }
    pDVar16 = (pDVar24->type).kids.T;
    if (pDVar16->index == DVar2 || pDVar16->index == DVar4) {
      ppDVar14 = (DdNode **)&pDVar16->type;
      pDVar16 = (pDVar16->type).kids.E;
    }
    else {
      ppDVar14 = &empty;
    }
    pDVar27 = (pDVar24->type).kids.E;
    if (pDVar27->index == DVar2 || pDVar27->index == DVar4) {
      ppDVar22 = (DdNode **)&pDVar27->type;
      pDVar27 = (pDVar27->type).kids.E;
    }
    else {
      ppDVar22 = &empty;
    }
    pDVar10 = pDVar24->next;
    pDVar18 = ((DdChildren *)ppDVar14)->T;
    pDVar30 = ((DdChildren *)ppDVar22)->T;
    pDVar15 = pDVar16;
    pDVar13 = pDVar16;
    if (pDVar30 != empty) {
      ppDVar14 = ppDVar9 + (int)((((uint)pDVar16 & 1) +
                                  *(int *)(((ulong)pDVar16 & 0xfffffffffffffffe) + 0x20) * 2 +
                                 (((uint)pDVar30 & 1) +
                                 *(int *)(((ulong)pDVar30 & 0xfffffffffffffffe) + 0x20) * 2) *
                                 0xc00005) * 0x40f1f9 >> (bVar19 & 0x1f));
      ppDVar22 = ppDVar14;
      while (pDVar15 = *ppDVar22, pDVar15 != (DdNode *)0x0) {
        if ((((pDVar15->type).kids.T == pDVar30) && ((pDVar15->type).kids.E == pDVar16)) &&
           (pDVar13 = pDVar15, pDVar15->index == DVar4)) goto LAB_0063a1a6;
        ppDVar22 = &pDVar15->next;
      }
      pDVar15 = cuddDynamicAllocNode(table);
      if (pDVar15 == (DdNode *)0x0) {
LAB_0063a4e1:
        fwrite("Error: cuddZddSwapInPlace out of memory\n",0x28,1,(FILE *)table->err);
        return 0;
      }
      pDVar15->index = DVar4;
      pDVar15->ref = 1;
      (pDVar15->type).kids.T = pDVar30;
      (pDVar15->type).kids.E = pDVar16;
      uVar29 = uVar29 + 1;
      pDVar15->next = *ppDVar14;
      *ppDVar14 = pDVar15;
      pDVar30->ref = pDVar30->ref + 1;
      pDVar13 = pDVar16;
    }
LAB_0063a1a6:
    pDVar13->ref = pDVar13->ref + 1;
    (pDVar24->type).kids.T = pDVar15;
    pDVar16 = pDVar27;
    pDVar30 = pDVar27;
    if (pDVar18 != empty) {
      ppDVar14 = ppDVar9 + (int)((((uint)pDVar27 & 1) +
                                  *(int *)(((ulong)pDVar27 & 0xfffffffffffffffe) + 0x20) * 2 +
                                 (((uint)pDVar18 & 1) +
                                 *(int *)(((ulong)pDVar18 & 0xfffffffffffffffe) + 0x20) * 2) *
                                 0xc00005) * 0x40f1f9 >> (bVar19 & 0x1f));
      ppDVar22 = ppDVar14;
      while (pDVar16 = *ppDVar22, pDVar16 != (DdNode *)0x0) {
        if ((((pDVar16->type).kids.T == pDVar18) && ((pDVar16->type).kids.E == pDVar27)) &&
           (pDVar30 = pDVar16, pDVar16->index == DVar4)) goto LAB_0063a275;
        ppDVar22 = &pDVar16->next;
      }
      pDVar16 = cuddDynamicAllocNode(table);
      if (pDVar16 == (DdNode *)0x0) goto LAB_0063a4e1;
      pDVar16->index = DVar4;
      pDVar16->ref = 1;
      (pDVar16->type).kids.T = pDVar18;
      (pDVar16->type).kids.E = pDVar27;
      uVar29 = uVar29 + 1;
      pDVar16->next = *ppDVar14;
      *ppDVar14 = pDVar16;
      pDVar18->ref = pDVar18->ref + 1;
      pDVar30 = pDVar27;
    }
LAB_0063a275:
    pDVar30->ref = pDVar30->ref + 1;
    (pDVar24->type).kids.E = pDVar16;
    uVar12 = (((uint)pDVar16 & 1) + *(int *)(((ulong)pDVar16 & 0xfffffffffffffffe) + 0x20) * 2 +
             (((uint)pDVar15 & 1) + *(int *)(((ulong)pDVar15 & 0xfffffffffffffffe) + 0x20) * 2) *
             0xc00005) * 0x40f1f9 >> (bVar20 & 0x1f);
    uVar26 = uVar26 + 1;
    pDVar24->next = ppDVar8[(int)uVar12];
    ppDVar8[(int)uVar12] = pDVar24;
    pDVar24 = pDVar10;
  } while( true );
LAB_0063a4d1:
  *ppDVar14 = pDVar16;
  goto LAB_0063a302;
}

Assistant:

static int
cuddZddLinearInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int         xindex, yindex;
    int         xslots, yslots;
    int         xshift, yshift;
    int         oldxkeys, oldykeys;
    int         newxkeys, newykeys;
    int         i;
    int         posn;
    DdNode      *f, *f1, *f0, *f11, *f10, *f01, *f00;
    DdNode      *newf1, *newf0, *g, *next, *previous;
    DdNode      *special;

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddZddNextHigh(table,x) == y);
    assert(table->subtableZ[x].keys != 0);
    assert(table->subtableZ[y].keys != 0);
    assert(table->subtableZ[x].dead == 0);
    assert(table->subtableZ[y].dead == 0);
#endif

    zddTotalNumberLinearTr++;

    /* Get parameters of x subtable. */
    xindex   = table->invpermZ[x];
    xlist    = table->subtableZ[x].nodelist;
    oldxkeys = table->subtableZ[x].keys;
    xslots   = table->subtableZ[x].slots;
    xshift   = table->subtableZ[x].shift;
    newxkeys = 0;

    /* Get parameters of y subtable. */
    yindex   = table->invpermZ[y];
    ylist    = table->subtableZ[y].nodelist;
    oldykeys = table->subtableZ[y].keys;
    yslots   = table->subtableZ[y].slots;
    yshift   = table->subtableZ[y].shift;
    newykeys = oldykeys;

    /* The nodes in the x layer are put in two chains.  The chain
    ** pointed by g holds the normal nodes. When re-expressed they stay
    ** in the x list. The chain pointed by special holds the elements
    ** that will move to the y list.
    */
    g = special = NULL;
    for (i = 0; i < xslots; i++) {
        f = xlist[i];
        if (f == NULL) continue;
        xlist[i] = NULL;
        while (f != NULL) {
            next = f->next;
            f1 = cuddT(f);
            /* if (f1->index == yindex) */ cuddSatDec(f1->ref);
            f0 = cuddE(f);
            /* if (f0->index == yindex) */ cuddSatDec(f0->ref);
            if ((int) f1->index == yindex && cuddE(f1) == empty &&
                (int) f0->index != yindex) {
                f->next = special;
                special = f;
            } else {
                f->next = g;
                g = f;
            }
            f = next;
        } /* while there are elements in the collision chain */
    } /* for each slot of the x subtable */

    /* Mark y nodes with pointers from above x. We mark them by
    **  changing their index to x.
    */
    for (i = 0; i < yslots; i++) {
        f = ylist[i];
        while (f != NULL) {
            if (f->ref != 0) {
                f->index = xindex;
            }
            f = f->next;
        } /* while there are elements in the collision chain */
    } /* for each slot of the y subtable */

    /* Move special nodes to the y list. */
    f = special;
    while (f != NULL) {
        next = f->next;
        f1 = cuddT(f);
        f11 = cuddT(f1);
        cuddT(f) = f11;
        cuddSatInc(f11->ref);
        f0 = cuddE(f);
        cuddSatInc(f0->ref);
        f->index = yindex;
        /* Insert at the beginning of the list so that it will be
        ** found first if there is a duplicate. The duplicate will
        ** eventually be moved or garbage collected. No node
        ** re-expression will add a pointer to it.
        */
        posn = ddHash(cuddF2L(f11), cuddF2L(f0), yshift);
        f->next = ylist[posn];
        ylist[posn] = f;
        newykeys++;
        f = next;
    }

    /* Take care of the remaining x nodes that must be re-expressed.
    ** They form a linked list pointed by g.
    */
    f = g;
    while (f != NULL) {
#ifdef DD_COUNT
        table->swapSteps++;
#endif
        next = f->next;
        /* Find f1, f0, f11, f10, f01, f00. */
        f1 = cuddT(f);
        if ((int) f1->index == yindex || (int) f1->index == xindex) {
            f11 = cuddT(f1); f10 = cuddE(f1);
        } else {
            f11 = empty; f10 = f1;
        }
        f0 = cuddE(f);
        if ((int) f0->index == yindex || (int) f0->index == xindex) {
            f01 = cuddT(f0); f00 = cuddE(f0);
        } else {
            f01 = empty; f00 = f0;
        }
        /* Create the new T child. */
        if (f01 == empty) {
            newf1 = f10;
            cuddSatInc(newf1->ref);
        } else {
            /* Check ylist for triple (yindex, f01, f10). */
            posn = ddHash(cuddF2L(f01), cuddF2L(f10), yshift);
            /* For each element newf1 in collision list ylist[posn]. */
            newf1 = ylist[posn];
            /* Search the collision chain skipping the marked nodes. */
            while (newf1 != NULL) {
                if (cuddT(newf1) == f01 && cuddE(newf1) == f10 &&
                    (int) newf1->index == yindex) {
                    cuddSatInc(newf1->ref);
                    break; /* match */
                }
                newf1 = newf1->next;
            } /* while newf1 */
            if (newf1 == NULL) {        /* no match */
                newf1 = cuddDynamicAllocNode(table);
                if (newf1 == NULL)
                    goto zddSwapOutOfMem;
                newf1->index = yindex; newf1->ref = 1;
                cuddT(newf1) = f01;
                cuddE(newf1) = f10;
                /* Insert newf1 in the collision list ylist[pos];
                ** increase the ref counts of f01 and f10
                */
                newykeys++;
                newf1->next = ylist[posn];
                ylist[posn] = newf1;
                cuddSatInc(f01->ref);
                cuddSatInc(f10->ref);
            }
        }
        cuddT(f) = newf1;

        /* Do the same for f0. */
        /* Create the new E child. */
        if (f11 == empty) {
            newf0 = f00;
            cuddSatInc(newf0->ref);
        } else {
            /* Check ylist for triple (yindex, f11, f00). */
            posn = ddHash(cuddF2L(f11), cuddF2L(f00), yshift);
            /* For each element newf0 in collision list ylist[posn]. */
            newf0 = ylist[posn];
            while (newf0 != NULL) {
                if (cuddT(newf0) == f11 && cuddE(newf0) == f00 &&
                    (int) newf0->index == yindex) {
                    cuddSatInc(newf0->ref);
                    break; /* match */
                }
                newf0 = newf0->next;
            } /* while newf0 */
            if (newf0 == NULL) {        /* no match */
                newf0 = cuddDynamicAllocNode(table);
                if (newf0 == NULL)
                    goto zddSwapOutOfMem;
                newf0->index = yindex; newf0->ref = 1;
                cuddT(newf0) = f11; cuddE(newf0) = f00;
                /* Insert newf0 in the collision list ylist[posn];
                ** increase the ref counts of f11 and f00.
                */
                newykeys++;
                newf0->next = ylist[posn];
                ylist[posn] = newf0;
                cuddSatInc(f11->ref);
                cuddSatInc(f00->ref);
            }
        }
        cuddE(f) = newf0;

        /* Re-insert the modified f in xlist.
        ** The modified f does not already exists in xlist.
        ** (Because of the uniqueness of the cofactors.)
        */
        posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), xshift);
        newxkeys++;
        f->next = xlist[posn];
        xlist[posn] = f;
        f = next;
    } /* while f != NULL */

    /* GC the y layer and move the marked nodes to the x list. */

    /* For each node f in ylist. */
    for (i = 0; i < yslots; i++) {
        previous = NULL;
        f = ylist[i];
        while (f != NULL) {
            next = f->next;
            if (f->ref == 0) {
                cuddSatDec(cuddT(f)->ref);
                cuddSatDec(cuddE(f)->ref);
                cuddDeallocNode(table, f);
                newykeys--;
                if (previous == NULL)
                    ylist[i] = next;
                else
                    previous->next = next;
            } else if ((int) f->index == xindex) { /* move marked node */
                if (previous == NULL)
                    ylist[i] = next;
                else
                    previous->next = next;
                f1 = cuddT(f);
                cuddSatDec(f1->ref);
                /* Check ylist for triple (yindex, f1, empty). */
                posn = ddHash(cuddF2L(f1), cuddF2L(empty), yshift);
                /* For each element newf1 in collision list ylist[posn]. */
                newf1 = ylist[posn];
                while (newf1 != NULL) {
                    if (cuddT(newf1) == f1 && cuddE(newf1) == empty &&
                        (int) newf1->index == yindex) {
                        cuddSatInc(newf1->ref);
                        break; /* match */
                    }
                    newf1 = newf1->next;
                } /* while newf1 */
                if (newf1 == NULL) {    /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto zddSwapOutOfMem;
                    newf1->index = yindex; newf1->ref = 1;
                    cuddT(newf1) = f1; cuddE(newf1) = empty;
                    /* Insert newf1 in the collision list ylist[posn];
                    ** increase the ref counts of f1 and empty.
                    */
                    newykeys++;
                    newf1->next = ylist[posn];
                    ylist[posn] = newf1;
                    if (posn == i && previous == NULL)
                        previous = newf1;
                    cuddSatInc(f1->ref);
                    cuddSatInc(empty->ref);
                }
                cuddT(f) = newf1;
                f0 = cuddE(f);
                /* Insert f in x list. */
                posn = ddHash(cuddF2L(newf1), cuddF2L(f0), xshift);
                newxkeys++;
                newykeys--;
                f->next = xlist[posn];
                xlist[posn] = f;
            } else {
                previous = f;
            }
            f = next;
        } /* while f */
    } /* for i */

    /* Set the appropriate fields in table. */
    table->subtableZ[x].keys     = newxkeys;
    table->subtableZ[y].keys     = newykeys;

    table->keysZ += newxkeys + newykeys - oldxkeys - oldykeys;

    /* Update univ section; univ[x] remains the same. */
    table->univ[y] = cuddT(table->univ[x]);

#if 0
    (void) fprintf(table->out,"x = %d  y = %d\n", x, y);
    (void) Cudd_DebugCheck(table);
    (void) Cudd_CheckKeys(table);
#endif

    return (table->keysZ);

zddSwapOutOfMem:
    (void) fprintf(table->err, "Error: cuddZddSwapInPlace out of memory\n");

    return (0);

}